

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_3> * tcu::operator*(Matrix<float,_4,_2> *a,Matrix<float,_2,_3> *b)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float *pfVar5;
  int row_1;
  undefined8 *puVar6;
  float *in_RDI;
  long lVar7;
  int row;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  bool bVar12;
  undefined4 uVar13;
  long lVar11;
  
  pfVar5 = in_RDI;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 6) = 0;
  in_RDI[0] = 0.0;
  in_RDI[1] = 0.0;
  *(undefined8 *)(in_RDI + 2) = 0;
  auVar4 = _DAT_00ada920;
  auVar3 = _DAT_00ad8f80;
  puVar6 = (undefined8 *)(in_RDI + 4);
  lVar7 = 0;
  lVar8 = 0;
  do {
    lVar9 = 0;
    auVar10 = auVar4;
    do {
      bVar12 = SUB164(auVar10 ^ auVar3,4) == -0x80000000 && SUB164(auVar10 ^ auVar3,0) < -0x7ffffffd
      ;
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar7 != lVar9) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)puVar6 + lVar9 + -0x10) = uVar13;
      }
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar7 + -0x10 != lVar9) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)puVar6 + lVar9) = uVar13;
      }
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x40);
    lVar8 = lVar8 + 1;
    lVar7 = lVar7 + 0x10;
    puVar6 = (undefined8 *)((long)puVar6 + 4);
  } while (lVar8 != 4);
  lVar7 = 0;
  do {
    fVar1 = (a->m_data).m_data[0].m_data[lVar7];
    fVar2 = (a->m_data).m_data[1].m_data[lVar7];
    lVar8 = 0;
    do {
      *(float *)((long)in_RDI + lVar8 * 2) =
           *(float *)((long)(b->m_data).m_data[0].m_data + lVar8 + 4) * fVar2 +
           *(float *)((long)(b->m_data).m_data[0].m_data + lVar8) * fVar1 + 0.0;
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x18);
    lVar7 = lVar7 + 1;
    in_RDI = in_RDI + 1;
  } while (lVar7 != 4);
  return (Matrix<float,_4,_3> *)pfVar5;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}